

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseConnection.cpp
# Opt level: O0

void __thiscall tonk::Connection::onDecodeFailure(Connection *this,Result *error)

{
  long *in_RSI;
  OutputWorker *in_RDI;
  bool isUnauthenticatedData;
  LogStringBuffer buffer;
  char *in_stack_fffffffffffffca8;
  LogStringBuffer *in_stack_fffffffffffffcb0;
  Result *in_stack_fffffffffffffcd8;
  LogStringBuffer *pLVar1;
  LogStringBuffer *buffer_00;
  OutputWorker *this_00;
  uint reason;
  uint3 in_stack_fffffffffffffcf8;
  uint uVar2;
  undefined4 in_stack_fffffffffffffcfc;
  string local_2f8 [39];
  char local_2d1;
  string *local_2c0;
  char *local_2b8;
  LogStringBuffer *local_2b0;
  string *local_2a8;
  char *local_2a0;
  undefined4 local_294;
  LogStringBuffer *local_290;
  undefined4 local_284;
  LogStringBuffer *local_280;
  undefined1 local_268 [16];
  ostream aoStack_258 [376];
  string *local_e0;
  char *local_d8;
  undefined4 local_cc;
  LogStringBuffer *local_c8;
  string *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  LogStringBuffer *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  LogStringBuffer *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  string *local_70;
  char *local_68;
  undefined1 *local_60;
  LogStringBuffer *local_58;
  string *local_50;
  undefined1 *local_48;
  LogStringBuffer *local_40;
  string *local_38;
  undefined1 *local_30;
  char *local_28;
  undefined1 *local_20;
  LogStringBuffer *local_18;
  char *local_10;
  undefined1 *local_8;
  
  uVar2 = (uint)in_stack_fffffffffffffcf8;
  if (*(int *)(*in_RSI + 0x28) == 0) {
    uVar2 = CONCAT13(*(long *)(*in_RSI + 0x30) == 0xf,in_stack_fffffffffffffcf8);
  }
  local_2d1 = (char)(uVar2 >> 0x18);
  if (local_2d1 == '\0') {
    pLVar1 = (LogStringBuffer *)(in_RDI[1].StartStopLock.super___mutex_base._M_mutex.__size + 0x10);
    this_00 = in_RDI;
    Result::ToJson_abi_cxx11_(in_stack_fffffffffffffcd8);
    local_2b8 = "Authenticated datagram decode failure: ";
    local_2c0 = local_2f8;
    local_294 = 4;
    local_2a0 = "Authenticated datagram decode failure: ";
    local_284 = 4;
    buffer_00 = pLVar1;
    local_2b0 = pLVar1;
    local_2a8 = local_2c0;
    local_290 = pLVar1;
    local_280 = pLVar1;
    if (*(int *)((long)&in_RDI[1].StartStopLock.super___mutex_base._M_mutex + 0x18) < 5) {
      local_cc = 4;
      local_d8 = "Authenticated datagram decode failure: ";
      local_e0 = local_2c0;
      local_c8 = pLVar1;
      logger::LogStringBuffer::LogStringBuffer
                (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,Trace);
      local_b0 = &pLVar1->field_0x38;
      local_a8 = local_268;
      local_b8 = local_d8;
      local_c0 = local_e0;
      local_a0 = pLVar1;
      local_98 = local_b0;
      local_90 = local_a8;
      local_88 = pLVar1;
      local_80 = local_b0;
      local_78 = local_a8;
      std::operator<<(aoStack_258,(string *)local_b0);
      local_60 = local_a8;
      local_68 = local_b8;
      local_70 = local_c0;
      local_20 = local_a8;
      local_28 = local_b8;
      local_8 = local_a8;
      local_10 = local_b8;
      local_58 = pLVar1;
      local_18 = pLVar1;
      std::operator<<((ostream *)(local_a8 + 0x10),local_b8);
      local_48 = local_60;
      local_50 = local_70;
      local_30 = local_60;
      local_38 = local_70;
      local_40 = pLVar1;
      std::operator<<((ostream *)(local_60 + 0x10),local_70);
      logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_00,buffer_00);
      logger::LogStringBuffer::~LogStringBuffer((LogStringBuffer *)0x1393d1);
    }
    reason = (uint)((ulong)this_00 >> 0x20);
    std::__cxx11::string::~string(local_2f8);
    RefCounter::StartShutdown
              ((RefCounter *)CONCAT44(in_stack_fffffffffffffcfc,uVar2),reason,(Result *)buffer_00);
  }
  return;
}

Assistant:

void Connection::onDecodeFailure(const Result& error)
{
    TONK_DEBUG_ASSERT(error.IsFail());

    const bool isUnauthenticatedData = \
        error.Error->Type == ErrorType::Tonk &&
        error.Error->Code == Tonk_BogonData;

    if (isUnauthenticatedData)
    {
        // Disabled this log
        //Logger.Debug("Bogon data ignored: ", error.ToJson());
        return;
    }

    Logger.Error("Authenticated datagram decode failure: ", error.ToJson());
    SelfRefCount.StartShutdown(Tonk_InvalidData, error);
}